

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O3

int pospopcnt_u16_avx512_harvey_seal(uint16_t *data,uint32_t len,uint32_t *flags)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  undefined1 (*pauVar4) [64];
  long lVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 auVar40 [16];
  undefined1 in_ZMM25 [64];
  undefined1 in_ZMM26 [64];
  undefined1 auVar41 [64];
  undefined1 in_ZMM28 [64];
  undefined8 uStack_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 uStack_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined1 auStack_5c0 [64];
  undefined1 auStack_580 [64];
  undefined1 auStack_540 [64];
  undefined1 auStack_500 [64];
  undefined1 auStack_4c0 [64];
  undefined1 auStack_480 [64];
  undefined1 auStack_440 [64];
  undefined1 auStack_400 [64];
  undefined1 auStack_3c0 [64];
  undefined1 auStack_380 [64];
  undefined1 auStack_340 [64];
  undefined1 auStack_300 [64];
  undefined1 auStack_2c0 [64];
  undefined1 auStack_280 [64];
  undefined1 auStack_240 [64];
  undefined1 auStack_200 [64];
  undefined1 auStack_1c0 [64];
  undefined1 auStack_180 [64];
  undefined1 auStack_140 [64];
  undefined1 auStack_100 [64];
  undefined1 auStack_c0 [64];
  
  if ((len & 0x1ff) != 0) {
    auVar13 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
    auVar14 = vpmovsxbd_avx512f(_DAT_0010f080);
    auVar15 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar3 = (ulong)(len & 0xfffffe00);
    do {
      uVar3 = uVar3 + 1;
      auVar16 = vpbroadcastd_avx512f();
      auVar16 = vpsrlvd_avx512f(auVar16,auVar14);
      auVar16 = vpandd_avx512f(auVar16,auVar15);
      auVar13 = vpaddd_avx512f(auVar16,auVar13);
    } while (uVar3 < len);
    auVar13 = vmovdqu64_avx512f(auVar13);
    *(undefined1 (*) [64])flags = auVar13;
  }
  uVar8 = len >> 5 & 0xfffffff0;
  uVar3 = (ulong)uVar8;
  auVar10 = in_ZMM28._0_16_;
  auVar11 = in_ZMM22._0_16_;
  auVar40 = in_ZMM25._0_16_;
  auVar9 = in_ZMM21._0_16_;
  if (uVar8 == 0) {
    auVar10 = vpxord_avx512vl(auVar10,auVar10);
    auVar16 = ZEXT1664(auVar10);
    auVar11 = vpxord_avx512vl(auVar11,auVar11);
    auVar15 = ZEXT1664(auVar11);
    auVar11 = vpxord_avx512vl(auVar40,auVar40);
    auVar13 = ZEXT1664(auVar11);
    auVar9 = vpxord_avx512vl(auVar9,auVar9);
    auVar14 = ZEXT1664(auVar9);
  }
  else {
    auVar9 = vpxord_avx512vl(auVar9,auVar9);
    auVar14 = ZEXT1664(auVar9);
    auVar9 = vpxord_avx512vl(in_ZMM26._0_16_,in_ZMM26._0_16_);
    auVar41 = ZEXT1664(auVar9);
    uVar7 = 0;
    auVar9 = vpxord_avx512vl(auVar40,auVar40);
    auVar13 = ZEXT1664(auVar9);
    auVar9 = vpxord_avx512vl(auVar11,auVar11);
    auVar15 = ZEXT1664(auVar9);
    auVar9 = vpxord_avx512vl(auVar10,auVar10);
    auVar16 = ZEXT1664(auVar9);
    do {
      auStack_5c0 = vmovdqa64_avx512f(auVar16);
      auStack_580 = vmovdqa64_avx512f(auVar15);
      auStack_540 = vmovdqa64_avx512f(auVar14);
      auStack_500 = vmovdqa64_avx512f(auVar41);
      auStack_4c0 = vmovdqa64_avx512f(auVar13);
      memset(auStack_440,0,0x3c0);
      uVar1 = uVar7 + 0xffff;
      if (uVar3 - uVar7 < 0x10000) {
        uVar1 = uVar3;
      }
      if (uVar7 < uVar1) {
        auVar13 = vmovdqa64_avx512f(auStack_4c0);
        auVar41 = vmovdqa64_avx512f(auStack_500);
        auVar17 = vpbroadcastw_avx512bw(ZEXT216(1));
        auVar14 = vmovdqa64_avx512f(auStack_540);
        auVar15 = vmovdqa64_avx512f(auStack_580);
        auVar16 = vmovdqa64_avx512f(auStack_5c0);
        auVar25 = ZEXT1664((undefined1  [16])0x0);
        auVar26 = ZEXT1664((undefined1  [16])0x0);
        auVar27 = ZEXT1664((undefined1  [16])0x0);
        auVar28 = ZEXT1664((undefined1  [16])0x0);
        auVar29 = ZEXT1664((undefined1  [16])0x0);
        auVar30 = ZEXT1664((undefined1  [16])0x0);
        auVar31 = ZEXT1664((undefined1  [16])0x0);
        auVar32 = ZEXT1664((undefined1  [16])0x0);
        auVar33 = ZEXT1664((undefined1  [16])0x0);
        auVar34 = ZEXT1664((undefined1  [16])0x0);
        auVar35 = ZEXT1664((undefined1  [16])0x0);
        auVar36 = ZEXT1664((undefined1  [16])0x0);
        auVar37 = ZEXT1664((undefined1  [16])0x0);
        auVar38 = ZEXT1664((undefined1  [16])0x0);
        auVar39 = ZEXT1664((undefined1  [16])0x0);
        auVar24 = ZEXT1664((undefined1  [16])0x0);
        pauVar4 = (undefined1 (*) [64])(data + uVar7 * 0x20 + 0x1e0);
        do {
          auVar18 = vmovdqu64_avx512f(pauVar4[-0xf]);
          auVar19 = vmovdqu64_avx512f(pauVar4[-0xe]);
          auVar20 = vmovdqu64_avx512f(pauVar4[-0xd]);
          auVar21 = vmovdqu64_avx512f(pauVar4[-0xc]);
          auVar14 = vmovdqa64_avx512f(auVar14);
          auVar22 = vmovdqu64_avx512f(pauVar4[-7]);
          uVar7 = uVar7 + 0x10;
          auVar23 = vmovdqa64_avx512f(auVar19);
          auVar19 = vpternlogd_avx512f(auVar19,auVar18,auVar16,0x96);
          auVar16 = vpternlogd_avx512f(auVar23,auVar18,auVar16,0xe8);
          auVar18 = vmovdqa64_avx512f(auVar21);
          auVar18 = vpternlogd_avx512f(auVar18,auVar20,auVar19,0xe8);
          auVar19 = vpternlogd_avx512f(auVar19,auVar20,auVar21,0x96);
          auVar20 = vmovdqu64_avx512f(pauVar4[-0xb]);
          auVar21 = vmovdqa64_avx512f(auVar18);
          auVar21 = vpternlogd_avx512f(auVar21,auVar16,auVar15,0xe8);
          auVar15 = vpternlogd_avx512f(auVar18,auVar16,auVar15,0x96);
          auVar16 = vmovdqu64_avx512f(pauVar4[-10]);
          auVar18 = vmovdqa64_avx512f(auVar16);
          auVar18 = vpternlogd_avx512f(auVar18,auVar20,auVar19,0xe8);
          auVar16 = vpternlogd_avx512f(auVar19,auVar20,auVar16,0x96);
          auVar19 = vmovdqu64_avx512f(pauVar4[-8]);
          auVar20 = vmovdqu64_avx512f(pauVar4[-9]);
          auVar23 = vmovdqa64_avx512f(auVar19);
          auVar23 = vpternlogd_avx512f(auVar23,auVar20,auVar16,0xe8);
          auVar16 = vpternlogd_avx512f(auVar16,auVar20,auVar19,0x96);
          auVar19 = vmovdqu64_avx512f(pauVar4[-6]);
          auVar20 = vmovdqa64_avx512f(auVar23);
          auVar20 = vpternlogd_avx512f(auVar20,auVar18,auVar15,0xe8);
          auVar15 = vpternlogd_avx512f(auVar23,auVar18,auVar15,0x96);
          auVar18 = vmovdqa64_avx512f(auVar20);
          auVar18 = vpternlogd_avx512f(auVar18,auVar21,auVar13,0xe8);
          auVar13 = vpternlogd_avx512f(auVar20,auVar21,auVar13,0x96);
          auVar20 = vmovdqu64_avx512f(pauVar4[-5]);
          auVar21 = vmovdqa64_avx512f(auVar19);
          auVar21 = vpternlogd_avx512f(auVar21,auVar22,auVar16,0xe8);
          auVar16 = vpternlogd_avx512f(auVar16,auVar22,auVar19,0x96);
          auVar19 = vmovdqu64_avx512f(pauVar4[-4]);
          auVar22 = vmovdqa64_avx512f(auVar19);
          auVar22 = vpternlogd_avx512f(auVar22,auVar20,auVar16,0xe8);
          auVar16 = vpternlogd_avx512f(auVar16,auVar20,auVar19,0x96);
          auVar19 = vmovdqu64_avx512f(pauVar4[-3]);
          auVar20 = vmovdqa64_avx512f(auVar22);
          auVar20 = vpternlogd_avx512f(auVar20,auVar21,auVar15,0xe8);
          auVar15 = vpternlogd_avx512f(auVar22,auVar21,auVar15,0x96);
          auVar21 = vmovdqu64_avx512f(pauVar4[-2]);
          auVar22 = vmovdqa64_avx512f(auVar21);
          auVar22 = vpternlogd_avx512f(auVar22,auVar19,auVar16,0xe8);
          auVar19 = vpternlogd_avx512f(auVar16,auVar19,auVar21,0x96);
          auVar21 = vmovdqu64_avx512f(pauVar4[-1]);
          auVar23 = vmovdqu64_avx512f(*pauVar4);
          pauVar4 = pauVar4 + 0x10;
          auVar16 = vmovdqa64_avx512f(auVar19);
          auVar16 = vpternlogd_avx512f(auVar16,auVar21,auVar23,0x96);
          auVar19 = vpternlogd_avx512f(auVar23,auVar21,auVar19,0xe8);
          auVar21 = vmovdqa64_avx512f(auVar19);
          auVar21 = vpternlogd_avx512f(auVar21,auVar22,auVar15,0xe8);
          auVar15 = vpternlogd_avx512f(auVar19,auVar22,auVar15,0x96);
          auVar19 = vmovdqa64_avx512f(auVar21);
          auVar19 = vpternlogd_avx512f(auVar19,auVar20,auVar13,0xe8);
          auVar13 = vpternlogd_avx512f(auVar21,auVar20,auVar13,0x96);
          auVar20 = vpandq_avx512f(auVar41,auVar17);
          auVar21 = vpsrlw_avx512bw(auVar41,1);
          auVar21 = vpandq_avx512f(auVar21,auVar17);
          auVar24 = vpaddw_avx512bw(auVar24,auVar20);
          auVar20 = vpsrlw_avx512bw(auVar41,2);
          auVar22 = vpsrlw_avx512bw(auVar41,3);
          auVar39 = vpaddw_avx512bw(auVar39,auVar21);
          auVar20 = vpandq_avx512f(auVar20,auVar17);
          auVar21 = vpsrlw_avx512bw(auVar41,4);
          auVar38 = vpaddw_avx512bw(auVar38,auVar20);
          auVar20 = vpandq_avx512f(auVar22,auVar17);
          auVar22 = vpsrlw_avx512bw(auVar41,5);
          auVar37 = vpaddw_avx512bw(auVar37,auVar20);
          auVar20 = vpandq_avx512f(auVar21,auVar17);
          auVar21 = vpsrlw_avx512bw(auVar41,6);
          auVar36 = vpaddw_avx512bw(auVar36,auVar20);
          auVar20 = vpandq_avx512f(auVar22,auVar17);
          auVar22 = vpsrlw_avx512bw(auVar41,7);
          auVar35 = vpaddw_avx512bw(auVar35,auVar20);
          auVar20 = vpandq_avx512f(auVar21,auVar17);
          auVar21 = vpsrlw_avx512bw(auVar41,8);
          auVar34 = vpaddw_avx512bw(auVar34,auVar20);
          auVar20 = vpandq_avx512f(auVar22,auVar17);
          auVar22 = vpsrlw_avx512bw(auVar41,9);
          auVar33 = vpaddw_avx512bw(auVar33,auVar20);
          auVar20 = vpandq_avx512f(auVar21,auVar17);
          auVar21 = vpsrlw_avx512bw(auVar41,10);
          auVar32 = vpaddw_avx512bw(auVar32,auVar20);
          auVar20 = vpandq_avx512f(auVar22,auVar17);
          auVar22 = vpsrlw_avx512bw(auVar41,0xb);
          auVar31 = vpaddw_avx512bw(auVar31,auVar20);
          auVar20 = vpandq_avx512f(auVar21,auVar17);
          auVar21 = vpsrlw_avx512bw(auVar41,0xc);
          auVar30 = vpaddw_avx512bw(auVar30,auVar20);
          auVar20 = vpandq_avx512f(auVar22,auVar17);
          auVar22 = vpsrlw_avx512bw(auVar41,0xd);
          auVar29 = vpaddw_avx512bw(auVar29,auVar20);
          auVar20 = vpandq_avx512f(auVar21,auVar17);
          auVar21 = vpsrlw_avx512bw(auVar41,0xe);
          auVar28 = vpaddw_avx512bw(auVar28,auVar20);
          auVar20 = vpandq_avx512f(auVar22,auVar17);
          auVar22 = vpsrlw_avx512bw(auVar41,0xf);
          auVar41 = vmovdqa64_avx512f(auVar19);
          auVar41 = vpternlogd_avx512f(auVar41,auVar18,auVar14,0xe8);
          auVar14 = vpternlogd_avx512f(auVar19,auVar18,auVar14,0x96);
          auVar27 = vpaddw_avx512bw(auVar27,auVar20);
          auVar18 = vpandq_avx512f(auVar21,auVar17);
          auVar25 = vpaddw_avx512bw(auVar25,auVar22);
          auVar26 = vpaddw_avx512bw(auVar26,auVar18);
        } while (uVar7 < uVar1);
        auStack_440 = vmovdqa64_avx512f(auVar39);
        auStack_400 = vmovdqa64_avx512f(auVar38);
        auStack_3c0 = vmovdqa64_avx512f(auVar37);
        auStack_380 = vmovdqa64_avx512f(auVar36);
        auStack_340 = vmovdqa64_avx512f(auVar35);
        auStack_300 = vmovdqa64_avx512f(auVar34);
        auStack_2c0 = vmovdqa64_avx512f(auVar33);
        auStack_280 = vmovdqa64_avx512f(auVar32);
        auStack_240 = vmovdqa64_avx512f(auVar31);
        auStack_200 = vmovdqa64_avx512f(auVar30);
        auStack_1c0 = vmovdqa64_avx512f(auVar29);
        auStack_180 = vmovdqa64_avx512f(auVar28);
        auStack_140 = vmovdqa64_avx512f(auVar27);
        auStack_100 = vmovdqa64_avx512f(auVar26);
        auStack_c0 = vmovdqa64_avx512f(auVar25);
      }
      else {
        auVar13 = vmovdqa64_avx512f(auStack_4c0);
        auVar41 = vmovdqa64_avx512f(auStack_500);
        auVar17 = vpbroadcastw_avx512bw(ZEXT216(1));
        auVar14 = vmovdqa64_avx512f(auStack_540);
        auVar15 = vmovdqa64_avx512f(auStack_580);
        auVar16 = vmovdqa64_avx512f(auStack_5c0);
        auVar24 = ZEXT1664((undefined1  [16])0x0);
      }
      lVar2 = 0;
      auStack_480 = vmovdqa64_avx512f(auVar24);
      do {
        auVar24 = vpandq_avx512f(auVar41,auVar17);
        auVar24 = vpaddw_avx512bw(auVar24,*(undefined1 (*) [64])(auStack_480 + lVar2));
        auVar41 = vpsrlw_avx512bw(auVar41,1);
        auVar24 = vmovdqa64_avx512f(auVar24);
        *(undefined1 (*) [64])(auStack_480 + lVar2) = auVar24;
        lVar2 = lVar2 + 0x40;
      } while (lVar2 != 0x400);
      lVar2 = 0;
      do {
        lVar5 = lVar2 * 0x40;
        lVar6 = 0;
        uStack_5f8 = *(undefined8 *)(auStack_480 + lVar5 + 8);
        uStack_600 = *(undefined8 *)(auStack_480 + lVar5);
        uStack_5f0 = *(undefined8 *)(auStack_480 + lVar5 + 0x10);
        uStack_5e8 = *(undefined8 *)(auStack_480 + lVar5 + 0x18);
        uStack_5e0 = *(undefined8 *)(auStack_480 + lVar5 + 0x20);
        uStack_5d8 = *(undefined8 *)(auStack_440 + lVar5 + -0x18);
        uStack_5d0 = *(undefined8 *)(auStack_440 + lVar5 + -0x10);
        uStack_5c8 = *(undefined8 *)(auStack_440 + lVar5 + -8);
        auVar17 = ZEXT464(flags[lVar2]);
        do {
          auVar24 = vpmovzxwd_avx512f(*(undefined1 (*) [32])((long)&uStack_600 + lVar6 * 2));
          lVar6 = lVar6 + 0x10;
          auVar24 = vpslld_avx512f(auVar24,4);
          auVar17 = vpaddd_avx512f(auVar24,auVar17);
        } while (lVar6 != 0x20);
        auVar12 = vextracti64x4_avx512f(auVar17,1);
        auVar17 = vpaddd_avx512f(auVar17,ZEXT3264(auVar12));
        auVar9 = vpaddd_avx(auVar17._0_16_,auVar17._16_16_);
        auVar11 = vpshufd_avx(auVar9,0xee);
        auVar9 = vpaddd_avx(auVar9,auVar11);
        auVar11 = vpshufd_avx(auVar9,0x55);
        auVar9 = vpaddd_avx(auVar9,auVar11);
        flags[lVar2] = auVar9._0_4_;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x10);
    } while (uVar7 < uVar3);
  }
  vmovdqu64_avx512f(auVar16);
  auVar16 = vpmovsxbd_avx512f(_DAT_0010f080);
  auVar41 = vpbroadcastd_avx512f(ZEXT416(1));
  lVar2 = 0;
  auVar17 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
  do {
    lVar2 = lVar2 + 1;
    auVar24 = vpbroadcastd_avx512f();
    auVar24 = vpsrlvd_avx512f(auVar24,auVar16);
    auVar24 = vpandd_avx512f(auVar24,auVar41);
    auVar17 = vpaddd_avx512f(auVar24,auVar17);
  } while (lVar2 != 0x20);
  auVar41 = vmovdqu64_avx512f(auVar17);
  *(undefined1 (*) [64])flags = auVar41;
  vmovdqu64_avx512f(auVar15);
  auVar15 = vpbroadcastd_avx512f(ZEXT416(2));
  lVar2 = 0;
  auVar41 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
  do {
    lVar2 = lVar2 + 1;
    auVar17 = vpbroadcastd_avx512f();
    auVar17 = vpsrlvd_avx512f(auVar17,auVar16);
    auVar17 = vpaddd_avx512f(auVar17,auVar17);
    auVar17 = vpandd_avx512f(auVar17,auVar15);
    auVar41 = vpaddd_avx512f(auVar17,auVar41);
  } while (lVar2 != 0x20);
  auVar15 = vmovdqu64_avx512f(auVar41);
  *(undefined1 (*) [64])flags = auVar15;
  vmovdqu64_avx512f(auVar13);
  auVar13 = vpbroadcastd_avx512f(ZEXT416(4));
  lVar2 = 0;
  auVar15 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
  do {
    lVar2 = lVar2 + 1;
    auVar41 = vpbroadcastd_avx512f();
    auVar41 = vpsrlvd_avx512f(auVar41,auVar16);
    auVar41 = vpslld_avx512f(auVar41,2);
    auVar41 = vpandd_avx512f(auVar41,auVar13);
    auVar15 = vpaddd_avx512f(auVar41,auVar15);
  } while (lVar2 != 0x20);
  auVar13 = vmovdqu64_avx512f(auVar15);
  *(undefined1 (*) [64])flags = auVar13;
  vmovdqu64_avx512f(auVar14);
  auVar13 = vpbroadcastd_avx512f(ZEXT416(8));
  lVar2 = 0;
  auVar14 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
  do {
    lVar2 = lVar2 + 1;
    auVar15 = vpbroadcastd_avx512f();
    auVar15 = vpsrlvd_avx512f(auVar15,auVar16);
    auVar15 = vpslld_avx512f(auVar15,3);
    auVar15 = vpandd_avx512f(auVar15,auVar13);
    auVar14 = vpaddd_avx512f(auVar15,auVar14);
  } while (lVar2 != 0x20);
  auVar13 = vmovdqu64_avx512f(auVar14);
  *(undefined1 (*) [64])flags = auVar13;
  return 0x20;
}

Assistant:

int pospopcnt_u16_avx512_harvey_seal(const uint16_t* data, uint32_t len, uint32_t* flags) { 
    #if defined(__AVX512BW__) && __AVX512BW__ == 1
    return pospopcnt_u16_avx512bw_harvey_seal(data, len, flags);
    #elif defined(__AVX512VBMI__) && __AVX512VBMI__ == 1
    return pospopcnt_u16_avx512vbmi_harvey_seal(data, len, flags);
    #else
    return(0);
    #endif
}